

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_event.hpp
# Opt level: O0

void __thiscall
asio::detail::posix_event::wait<asio::detail::scoped_lock<asio::detail::posix_mutex>>
          (posix_event *this,scoped_lock<asio::detail::posix_mutex> *lock)

{
  bool bVar1;
  pthread_mutex_t *__mutex;
  scoped_lock<asio::detail::posix_mutex> *in_RSI;
  pthread_cond_t *in_RDI;
  
  bVar1 = scoped_lock<asio::detail::posix_mutex>::locked(in_RSI);
  if (bVar1) {
    while ((in_RDI[1].__align & 1U) == 0) {
      in_RDI[1].__align = in_RDI[1].__align + 2;
      __mutex = (pthread_mutex_t *)scoped_lock<asio::detail::posix_mutex>::mutex(in_RSI);
      pthread_cond_wait(in_RDI,__mutex);
      in_RDI[1].__align = in_RDI[1].__align + -2;
    }
    return;
  }
  __assert_fail("lock.locked()",
                "/workspace/llm4binary/github/license_c_cmakelists/catid[P]mau/thirdparty/asio/detail/posix_event.hpp"
                ,0x65,
                "void asio::detail::posix_event::wait(Lock &) [Lock = asio::detail::scoped_lock<asio::detail::posix_mutex>]"
               );
}

Assistant:

void wait(Lock& lock)
  {
    ASIO_ASSERT(lock.locked());
    while ((state_ & 1) == 0)
    {
      state_ += 2;
      ::pthread_cond_wait(&cond_, &lock.mutex().mutex_); // Ignore EINVAL.
      state_ -= 2;
    }
  }